

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  StyledStreamWriter *this_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  AVar2 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (0 < (int)AVar2 && !bVar1) {
    iVar5 = 1;
    do {
      pVVar4 = Value::operator[](value,iVar5 + -1);
      bVar8 = bVar1 == false;
      bVar1 = true;
      if (bVar8) {
        bVar1 = Value::isArray(pVVar4);
        if (!bVar1) {
          bVar1 = Value::isObject(pVVar4);
          if (!bVar1) {
            bVar1 = false;
            goto LAB_001e9441;
          }
        }
        AVar3 = Value::size(pVVar4);
        bVar1 = AVar3 != 0;
      }
LAB_001e9441:
    } while ((iVar5 < (int)AVar2) && (iVar5 = iVar5 + 1, bVar1 == false));
  }
  if (bVar1 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar2);
    this->addChildValues_ = true;
    iVar5 = AVar2 * 2 + 2;
    bVar1 = false;
    if (0 < (int)AVar2) {
      lVar6 = 8;
      uVar7 = 0;
      bVar1 = false;
      do {
        pVVar4 = Value::operator[](value,(int)uVar7);
        writeValue(this,pVVar4);
        iVar5 = iVar5 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar6);
        if (bVar1 == false) {
          bVar1 = false;
        }
        else {
          this_00 = (StyledStreamWriter *)value;
          pVVar4 = Value::operator[](value,(int)uVar7);
          bVar1 = hasCommentForValue(this_00,pVVar4);
        }
        uVar7 = uVar7 + 1;
      } while ((uVar7 < AVar2) && (lVar6 = lVar6 + 0x20, bVar1 == false));
    }
    this->addChildValues_ = false;
    bVar1 = (bool)(this->rightMargin_ <= iVar5 | bVar1);
  }
  return bVar1;
}

Assistant:

bool 
StyledStreamWriter::isMultineArray( const Value &value )
{
   int size = value.size();
   bool isMultiLine = size*3 >= rightMargin_ ;
   childValues_.clear();
   for ( int index =0; index < size  &&  !isMultiLine; ++index )
   {
      const Value &childValue = value[index];
      isMultiLine = isMultiLine  ||
                     ( (childValue.isArray()  ||  childValue.isObject())  &&  
                        childValue.size() > 0 );
   }
   if ( !isMultiLine ) // check if line length > max line length
   {
      childValues_.reserve( size );
      addChildValues_ = true;
      int lineLength = 4 + (size-1)*2; // '[ ' + ', '*n + ' ]'
      for ( int index =0; index < size  &&  !isMultiLine; ++index )
      {
         writeValue( value[index] );
         lineLength += int( childValues_[index].length() );
         isMultiLine = isMultiLine  &&  hasCommentForValue( value[index] );
      }
      addChildValues_ = false;
      isMultiLine = isMultiLine  ||  lineLength >= rightMargin_;
   }
   return isMultiLine;
}